

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * __thiscall Rml::Element::GetNextSibling(Element *this)

{
  Element *pEVar1;
  pointer puVar2;
  long lVar3;
  
  pEVar1 = this->parent;
  if (pEVar1 != (Element *)0x0) {
    puVar2 = (pEVar1->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar3 = 1;
        ((long)(pEVar1->children).
               super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) -
        (long)pEVar1->num_non_dom_children != lVar3; lVar3 = lVar3 + 1) {
      if ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
          puVar2[lVar3 + -1]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
          _M_t == (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)this) {
        return (Element *)
               ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
               puVar2[lVar3]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
               _M_t).super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>;
      }
    }
  }
  return (Element *)0x0;
}

Assistant:

Element* Element::GetNextSibling() const
{
	if (parent == nullptr)
		return nullptr;

	for (size_t i = 0; i < parent->children.size() - (parent->num_non_dom_children + 1); i++)
	{
		if (parent->children[i].get() == this)
			return parent->children[i + 1].get();
	}

	return nullptr;
}